

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

uchar * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  int iVar1;
  uchar *puVar2;
  float *data;
  stbi__context *in_RCX;
  stbi__context *in_RDX;
  int *in_RSI;
  undefined4 in_R8D;
  int *unaff_retaddr;
  int *in_stack_00000008;
  int *in_stack_00000010;
  stbi__context *in_stack_00000018;
  float *hdr;
  int *in_stack_00000050;
  stbi__context *in_stack_00000058;
  int in_stack_000003fc;
  int *in_stack_00000400;
  int *in_stack_00000408;
  int *in_stack_00000410;
  stbi__context *in_stack_00000418;
  int in_stack_0000045c;
  int *in_stack_00000460;
  int *in_stack_00000468;
  int *in_stack_00000470;
  stbi__context *in_stack_00000478;
  int in_stack_00004724;
  int *in_stack_00004728;
  stbi__context *in_stack_00004730;
  int *in_stack_00004738;
  stbi__context *in_stack_00004740;
  int in_stack_00004804;
  int *in_stack_00004808;
  int *in_stack_00004810;
  int *in_stack_00004818;
  stbi__context *in_stack_00004820;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  stbi__context *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined8 in_stack_fffffffffffffff8;
  int req_comp_00;
  
  req_comp_00 = (int)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  iVar1 = stbi__jpeg_test(in_stack_00004730);
  if (iVar1 == 0) {
    iVar1 = stbi__png_test((stbi__context *)
                           CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    if (iVar1 == 0) {
      iVar1 = stbi__bmp_test((stbi__context *)
                             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      if (iVar1 == 0) {
        iVar1 = stbi__gif_test((stbi__context *)
                               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        if (iVar1 == 0) {
          iVar1 = stbi__psd_test((stbi__context *)
                                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
          if (iVar1 == 0) {
            iVar1 = stbi__pic_test((stbi__context *)
                                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
            if (iVar1 == 0) {
              iVar1 = stbi__pnm_test((stbi__context *)
                                     CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
              if (iVar1 == 0) {
                iVar1 = stbi__hdr_test((stbi__context *)
                                       CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                                      );
                if (iVar1 == 0) {
                  iVar1 = stbi__tga_test((stbi__context *)
                                         CONCAT44(in_stack_ffffffffffffffac,
                                                  in_stack_ffffffffffffffa8));
                  if (iVar1 == 0) {
                    stbi__err("unknown image type");
                    puVar2 = (uchar *)0x0;
                  }
                  else {
                    puVar2 = stbi__tga_load(in_stack_00000058,in_stack_00000050,(int *)s,x,y._4_4_);
                  }
                }
                else {
                  data = stbi__hdr_load(in_stack_00000418,in_stack_00000410,in_stack_00000408,
                                        in_stack_00000400,in_stack_000003fc);
                  puVar2 = stbi__hdr_to_ldr(data,in_RDX->img_x,*in_RSI,(int)((ulong)data >> 0x20));
                }
              }
              else {
                puVar2 = stbi__pnm_load(in_stack_ffffffffffffffc8,
                                        (int *)CONCAT44(in_stack_ffffffffffffffc4,
                                                        in_stack_ffffffffffffffc0),
                                        in_stack_ffffffffffffffb8,
                                        (int *)CONCAT44(in_stack_ffffffffffffffb4,
                                                        in_stack_ffffffffffffffb0),
                                        in_stack_ffffffffffffffac);
              }
            }
            else {
              puVar2 = stbi__pic_load(in_RCX,(int *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                                      (int *)in_stack_ffffffffffffffc8,
                                      (int *)CONCAT44(in_stack_ffffffffffffffc4,
                                                      in_stack_ffffffffffffffc0),
                                      (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
            }
          }
          else {
            puVar2 = stbi__psd_load(in_stack_00000018,in_stack_00000010,in_stack_00000008,
                                    unaff_retaddr,req_comp_00);
          }
        }
        else {
          puVar2 = stbi__gif_load(in_stack_00004820,in_stack_00004818,in_stack_00004810,
                                  in_stack_00004808,in_stack_00004804);
        }
      }
      else {
        puVar2 = stbi__bmp_load(in_stack_00000478,in_stack_00000470,in_stack_00000468,
                                in_stack_00000460,in_stack_0000045c);
      }
    }
    else {
      puVar2 = stbi__png_load(in_RDX,(int *)in_RCX,(int *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0)
                              ,(int *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
    }
  }
  else {
    puVar2 = stbi__jpeg_load(in_stack_00004740,in_stack_00004738,(int *)in_stack_00004730,
                             in_stack_00004728,in_stack_00004724);
  }
  return puVar2;
}

Assistant:

static unsigned char *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}